

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_test.cc
# Opt level: O0

void re2::TestRegexpCompileToProgSimple(void)

{
  bool bVar1;
  ParseFlags global_flags;
  ostream *poVar2;
  Prog *pPVar3;
  LogMessage local_ae8;
  LogMessage local_968;
  LogMessage local_7e8;
  LogMessage local_668;
  undefined1 local_4e8 [8];
  string s;
  LogMessage local_4c8;
  LogMessage local_348;
  Prog *local_1c8;
  Prog *prog;
  LogMessage local_1b0;
  StringPiece local_30;
  Regexp *local_20;
  Regexp *re;
  Test *t;
  int i;
  int failed;
  
  t._4_4_ = 0;
  for (t._0_4_ = 0; (int)t < 0x16; t._0_4_ = (int)t + 1) {
    re = (Regexp *)(tests + (long)(int)t * 0x10);
    StringPiece::StringPiece(&local_30,*(char **)re);
    global_flags = operator|(PerlX,Latin1);
    local_20 = Regexp::Parse(&local_30,global_flags,(RegexpStatus *)0x0);
    if (local_20 == (Regexp *)0x0) {
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/compile_test.cc"
                 ,0x79,2);
      poVar2 = LogMessage::stream(&local_1b0);
      poVar2 = std::operator<<(poVar2,"Cannot parse: ");
      std::operator<<(poVar2,*(char **)re);
      LogMessage::~LogMessage(&local_1b0);
      t._4_4_ = t._4_4_ + 1;
    }
    else {
      local_1c8 = Regexp::CompileToProg(local_20,0);
      if (local_1c8 == (Prog *)0x0) {
        LogMessage::LogMessage
                  (&local_348,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/compile_test.cc"
                   ,0x7f,2);
        poVar2 = LogMessage::stream(&local_348);
        poVar2 = std::operator<<(poVar2,"Cannot compile: ");
        std::operator<<(poVar2,*(char **)re);
        LogMessage::~LogMessage(&local_348);
        Regexp::Decref(local_20);
        t._4_4_ = t._4_4_ + 1;
      }
      else {
        pPVar3 = Regexp::CompileToProg(local_20,1);
        if (pPVar3 != (Prog *)0x0) {
          LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_4c8,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/compile_test.cc"
                     ,0x84);
          poVar2 = LogMessage::stream(&local_4c8);
          std::operator<<(poVar2,"Check failed: re->CompileToProg(1) == NULL");
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_4c8);
        }
        Prog::Dump_abi_cxx11_((Prog *)local_4e8);
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_4e8,(char *)(re->field_5).submany_);
        if (bVar1) {
          LogMessage::LogMessage
                    (&local_668,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/compile_test.cc"
                     ,0x87,2);
          poVar2 = LogMessage::stream(&local_668);
          poVar2 = std::operator<<(poVar2,"Incorrect compiled code for: ");
          std::operator<<(poVar2,*(char **)re);
          LogMessage::~LogMessage(&local_668);
          LogMessage::LogMessage
                    (&local_7e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/compile_test.cc"
                     ,0x88,2);
          poVar2 = LogMessage::stream(&local_7e8);
          poVar2 = std::operator<<(poVar2,"Want:\n");
          std::operator<<(poVar2,(char *)(re->field_5).submany_);
          LogMessage::~LogMessage(&local_7e8);
          LogMessage::LogMessage
                    (&local_968,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/compile_test.cc"
                     ,0x89,2);
          poVar2 = LogMessage::stream(&local_968);
          poVar2 = std::operator<<(poVar2,"Got:\n");
          std::operator<<(poVar2,(string *)local_4e8);
          LogMessage::~LogMessage(&local_968);
          t._4_4_ = t._4_4_ + 1;
        }
        pPVar3 = local_1c8;
        if (local_1c8 != (Prog *)0x0) {
          Prog::~Prog(local_1c8);
          operator_delete(pPVar3);
        }
        Regexp::Decref(local_20);
        std::__cxx11::string::~string((string *)local_4e8);
      }
    }
  }
  if (t._4_4_ != 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_ae8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/compile_test.cc"
               ,0x8f);
    poVar2 = LogMessage::stream(&local_ae8);
    std::operator<<(poVar2,"Check failed: (failed) == (0)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_ae8);
  }
  return;
}

Assistant:

TEST(TestRegexpCompileToProg, Simple) {
  int failed = 0;
  for (int i = 0; i < arraysize(tests); i++) {
    const re2::Test& t = tests[i];
    Regexp* re = Regexp::Parse(t.regexp, Regexp::PerlX|Regexp::Latin1, NULL);
    if (re == NULL) {
      LOG(ERROR) << "Cannot parse: " << t.regexp;
      failed++;
      continue;
    }
    Prog* prog = re->CompileToProg(0);
    if (prog == NULL) {
      LOG(ERROR) << "Cannot compile: " << t.regexp;
      re->Decref();
      failed++;
      continue;
    }
    CHECK(re->CompileToProg(1) == NULL);
    string s = prog->Dump();
    if (s != t.code) {
      LOG(ERROR) << "Incorrect compiled code for: " << t.regexp;
      LOG(ERROR) << "Want:\n" << t.code;
      LOG(ERROR) << "Got:\n" << s;
      failed++;
    }
    delete prog;
    re->Decref();
  }
  EXPECT_EQ(failed, 0);
}